

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac_acpkm.c
# Opt level: O0

void CMAC_ACPKM_CTX_free(CMAC_ACPKM_CTX *ctx)

{
  undefined8 *in_RDI;
  
  if (in_RDI != (undefined8 *)0x0) {
    CMAC_ACPKM_CTX_cleanup((CMAC_ACPKM_CTX *)0x120807);
    EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)*in_RDI);
    EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)in_RDI[1]);
    CRYPTO_free(in_RDI);
  }
  return;
}

Assistant:

static void CMAC_ACPKM_CTX_free(CMAC_ACPKM_CTX *ctx)
{
    if (!ctx)
        return;
    CMAC_ACPKM_CTX_cleanup(ctx);
    EVP_CIPHER_CTX_free(ctx->cctx);
    EVP_CIPHER_CTX_free(ctx->actx);
    OPENSSL_free(ctx);
}